

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse
          (Impl *this,StateCreatorInterface *iface,DatabaseInterface *resolver,void *buffer_,
          size_t total_size)

{
  void *pvVar1;
  DatabaseInterface *pDVar2;
  bool bVar3;
  ParseErrorCode PVar4;
  int iVar5;
  LogLevel LVar6;
  Type pGVar7;
  Type pdf_info;
  Ch *str;
  uint64_t uVar8;
  int version;
  undefined1 local_c8 [4];
  ParseErrorCode error;
  Document doc;
  size_t json_size;
  size_t varint_size;
  uint8_t *varint_buffer;
  uchar *local_48;
  uchar *itr;
  uint8_t *buffer;
  size_t total_size_local;
  void *buffer__local;
  DatabaseInterface *resolver_local;
  StateCreatorInterface *iface_local;
  Impl *this_local;
  
  varint_buffer._7_1_ = 0;
  itr = (uchar *)buffer_;
  buffer = (uint8_t *)total_size;
  total_size_local = (size_t)buffer_;
  buffer__local = resolver;
  resolver_local = (DatabaseInterface *)iface;
  iface_local = (StateCreatorInterface *)this;
  local_48 = std::find<unsigned_char_const*,char>
                       ((uchar *)buffer_,(uchar *)((long)buffer_ + total_size),
                        (char *)((long)&varint_buffer + 7));
  varint_size = 0;
  json_size = 0;
  doc.parseResult_.offset_ = (long)local_48 - (long)itr;
  if (local_48 < itr + (long)buffer) {
    varint_size = (size_t)(local_48 + 1);
    json_size = (long)(itr + (long)buffer) - varint_size;
  }
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                     *)local_c8,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                    (CrtAllocator *)0x0);
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::Parse((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
           *)local_c8,(Ch *)itr,doc.parseResult_.offset_);
  bVar3 = rapidjson::
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          ::HasParseError((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                           *)local_c8);
  if (bVar3) {
    PVar4 = rapidjson::
            GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::GetParseError((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                             *)local_c8);
    LVar6 = get_thread_log_level();
    if (((int)LVar6 < 3) &&
       (bVar3 = Internal::log_thread_callback(LOG_ERROR,"Got parse error: %d\n",(ulong)PVar4),
       !bVar3)) {
      fprintf(_stderr,"Fossilize ERROR: Got parse error: %d\n",(ulong)PVar4);
    }
    this_local._7_1_ = 0;
  }
  else {
    pGVar7 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)local_c8,"version");
    iVar5 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetInt(pGVar7);
    if ((iVar5 < 7) && (4 < iVar5)) {
      bVar3 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)local_c8,"applicationInfo");
      if ((bVar3) &&
         (bVar3 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                               *)local_c8,"physicalDeviceFeatures"), pDVar2 = resolver_local, bVar3)
         ) {
        pGVar7 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)local_c8,"applicationInfo");
        pdf_info = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)local_c8,"physicalDeviceFeatures");
        bVar3 = parse_application_info(this,(StateCreatorInterface *)pDVar2,pGVar7,pdf_info);
        if (!bVar3) {
          this_local._7_1_ = 0;
          goto LAB_00125a14;
        }
      }
      bVar3 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)local_c8,"application");
      pDVar2 = resolver_local;
      if (bVar3) {
        pGVar7 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)local_c8,"application");
        str = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetString(pGVar7);
        uVar8 = string_to_uint64(str);
        (*pDVar2->_vptr_DatabaseInterface[3])(pDVar2,uVar8);
      }
      bVar3 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)local_c8,"link");
      pDVar2 = resolver_local;
      if (bVar3) {
        pGVar7 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)local_c8,"link");
        bVar3 = parse_application_info_link(this,(StateCreatorInterface *)pDVar2,pGVar7);
        if (!bVar3) {
          this_local._7_1_ = 0;
          goto LAB_00125a14;
        }
      }
      bVar3 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)local_c8,"shaderModules");
      pDVar2 = resolver_local;
      if (bVar3) {
        pGVar7 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)local_c8,"shaderModules");
        bVar3 = parse_shader_modules
                          (this,(StateCreatorInterface *)pDVar2,pGVar7,(uint8_t *)varint_size,
                           json_size);
        if (!bVar3) {
          this_local._7_1_ = 0;
          goto LAB_00125a14;
        }
      }
      bVar3 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)local_c8,"samplers");
      pDVar2 = resolver_local;
      if (bVar3) {
        pGVar7 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)local_c8,"samplers");
        bVar3 = parse_samplers(this,(StateCreatorInterface *)pDVar2,pGVar7);
        if (!bVar3) {
          this_local._7_1_ = 0;
          goto LAB_00125a14;
        }
      }
      bVar3 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)local_c8,"setLayouts");
      pDVar2 = resolver_local;
      pvVar1 = buffer__local;
      if (bVar3) {
        pGVar7 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)local_c8,"setLayouts");
        bVar3 = parse_descriptor_set_layouts
                          (this,(StateCreatorInterface *)pDVar2,(DatabaseInterface *)pvVar1,pGVar7);
        if (!bVar3) {
          this_local._7_1_ = 0;
          goto LAB_00125a14;
        }
      }
      bVar3 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)local_c8,"pipelineLayouts");
      pDVar2 = resolver_local;
      if (bVar3) {
        pGVar7 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)local_c8,"pipelineLayouts");
        bVar3 = parse_pipeline_layouts(this,(StateCreatorInterface *)pDVar2,pGVar7);
        if (!bVar3) {
          this_local._7_1_ = 0;
          goto LAB_00125a14;
        }
      }
      bVar3 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)local_c8,"renderPasses");
      pDVar2 = resolver_local;
      if (bVar3) {
        pGVar7 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)local_c8,"renderPasses");
        bVar3 = parse_render_passes(this,(StateCreatorInterface *)pDVar2,pGVar7);
        if (!bVar3) {
          this_local._7_1_ = 0;
          goto LAB_00125a14;
        }
      }
      bVar3 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)local_c8,"renderPasses2");
      pDVar2 = resolver_local;
      if (bVar3) {
        pGVar7 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)local_c8,"renderPasses2");
        bVar3 = parse_render_passes2(this,(StateCreatorInterface *)pDVar2,pGVar7);
        if (!bVar3) {
          this_local._7_1_ = 0;
          goto LAB_00125a14;
        }
      }
      bVar3 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)local_c8,"computePipelines");
      pDVar2 = resolver_local;
      pvVar1 = buffer__local;
      if (bVar3) {
        pGVar7 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)local_c8,"computePipelines");
        bVar3 = parse_compute_pipelines
                          (this,(StateCreatorInterface *)pDVar2,(DatabaseInterface *)pvVar1,pGVar7);
        if (!bVar3) {
          this_local._7_1_ = 0;
          goto LAB_00125a14;
        }
      }
      bVar3 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)local_c8,"graphicsPipelines");
      pDVar2 = resolver_local;
      pvVar1 = buffer__local;
      if (bVar3) {
        pGVar7 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)local_c8,"graphicsPipelines");
        bVar3 = parse_graphics_pipelines
                          (this,(StateCreatorInterface *)pDVar2,(DatabaseInterface *)pvVar1,pGVar7);
        if (!bVar3) {
          this_local._7_1_ = 0;
          goto LAB_00125a14;
        }
      }
      bVar3 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                           *)local_c8,"raytracingPipelines");
      pDVar2 = resolver_local;
      pvVar1 = buffer__local;
      if (bVar3) {
        pGVar7 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)local_c8,"raytracingPipelines");
        bVar3 = parse_raytracing_pipelines
                          (this,(StateCreatorInterface *)pDVar2,(DatabaseInterface *)pvVar1,pGVar7);
        if (!bVar3) {
          this_local._7_1_ = 0;
          goto LAB_00125a14;
        }
      }
      this_local._7_1_ = 1;
    }
    else {
      LVar6 = get_thread_log_level();
      if (((int)LVar6 < 3) &&
         (bVar3 = Internal::log_thread_callback(LOG_ERROR,"JSON version mismatches."), !bVar3)) {
        fprintf(_stderr,"Fossilize ERROR: JSON version mismatches.");
      }
      this_local._7_1_ = 0;
    }
  }
LAB_00125a14:
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::~GenericDocument((GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                      *)local_c8);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool StateReplayer::Impl::parse(StateCreatorInterface &iface, DatabaseInterface *resolver, const void *buffer_, size_t total_size)
{
	// All data after a string terminating '\0' is considered binary payload
	// which can be read for various purposes (SPIR-V varint for example).
	const uint8_t *buffer = static_cast<const uint8_t *>(buffer_);
	auto itr = find(buffer, buffer + total_size, '\0');
	const uint8_t *varint_buffer = nullptr;
	size_t varint_size = 0;
	size_t json_size = itr - buffer;

	if (itr < buffer + total_size)
	{
		varint_buffer = itr + 1;
		varint_size = (buffer + total_size) - varint_buffer;
	}

	Document doc;
	doc.Parse(reinterpret_cast<const char *>(buffer), json_size);

	if (doc.HasParseError())
	{
		auto error = doc.GetParseError();
		LOGE_LEVEL("Got parse error: %d\n", int(error));
		return false;
	}

	int version = doc["version"].GetInt();
	if (version > FOSSILIZE_FORMAT_VERSION || version < FOSSILIZE_FORMAT_MIN_COMPAT_VERSION)
	{
		LOGE_LEVEL("JSON version mismatches.");
		return false;
	}

	if (doc.HasMember("applicationInfo") && doc.HasMember("physicalDeviceFeatures"))
		if (!parse_application_info(iface, doc["applicationInfo"], doc["physicalDeviceFeatures"]))
			return false;

	if (doc.HasMember("application"))
		iface.set_current_application_info(string_to_uint64(doc["application"].GetString()));

	if (doc.HasMember("link"))
		if (!parse_application_info_link(iface, doc["link"]))
			return false;

	if (doc.HasMember("shaderModules"))
		if (!parse_shader_modules(iface, doc["shaderModules"], varint_buffer, varint_size))
			return false;

	if (doc.HasMember("samplers"))
		if (!parse_samplers(iface, doc["samplers"]))
			return false;

	if (doc.HasMember("setLayouts"))
		if (!parse_descriptor_set_layouts(iface, resolver, doc["setLayouts"]))
			return false;

	if (doc.HasMember("pipelineLayouts"))
		if (!parse_pipeline_layouts(iface, doc["pipelineLayouts"]))
			return false;

	if (doc.HasMember("renderPasses"))
		if (!parse_render_passes(iface, doc["renderPasses"]))
			return false;

	if (doc.HasMember("renderPasses2"))
		if (!parse_render_passes2(iface, doc["renderPasses2"]))
			return false;

	if (doc.HasMember("computePipelines"))
		if (!parse_compute_pipelines(iface, resolver, doc["computePipelines"]))
			return false;

	if (doc.HasMember("graphicsPipelines"))
		if (!parse_graphics_pipelines(iface, resolver, doc["graphicsPipelines"]))
			return false;

	if (doc.HasMember("raytracingPipelines"))
		if (!parse_raytracing_pipelines(iface, resolver, doc["raytracingPipelines"]))
			return false;

	return true;
}